

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::isIntegralConversion(TIntermediate *this,TBasicType from,TBasicType to)

{
  EShSource EVar1;
  bool local_35;
  TBasicType to_local;
  TBasicType from_local;
  TIntermediate *this_local;
  
  switch(from) {
  case EbtInt8:
    if ((to - EbtUint8 < 3) || (to - EbtUint < 3)) {
      return true;
    }
    break;
  case EbtUint8:
    if ((to - EbtInt16 < 2) || (to - EbtUint < 3)) {
      return true;
    }
    break;
  case EbtInt16:
    if ((to == EbtUint16) || (to - EbtUint < 3)) {
      return true;
    }
    break;
  case EbtUint16:
    if (to - EbtUint < 3) {
      return true;
    }
    break;
  case EbtInt:
    if (to == EbtUint) {
      local_35 = true;
      if (this->version < 400) {
        EVar1 = getSource(this);
        local_35 = EVar1 == EShSourceHlsl;
      }
      return local_35;
    }
    if (to - EbtInt64 < 2) {
      return true;
    }
    break;
  case EbtUint:
    if (to == EbtInt64 || to == EbtUint64) {
      return true;
    }
    break;
  case EbtInt64:
    if (to == EbtUint64) {
      return true;
    }
  }
  return false;
}

Assistant:

bool TIntermediate::isIntegralConversion(TBasicType from, TBasicType to) const
{
    switch (from) {
    case EbtInt:
        switch(to) {
        case EbtUint:
            return version >= 400 || getSource() == EShSourceHlsl;
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtUint:
        switch(to) {
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtInt8:
        switch (to) {
        case EbtUint8:
        case EbtInt16:
        case EbtUint16:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtUint8:
        switch (to) {
        case EbtInt16:
        case EbtUint16:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtInt16:
        switch(to) {
        case EbtUint16:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtUint16:
        switch(to) {
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtInt64:
        if (to == EbtUint64) {
            return true;
        }
        break;
    default:
        break;
    }
    return false;
}